

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_backend_timeout(uv_loop_t *loop)

{
  uv_timer_s *puVar1;
  ulong uVar2;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar3;
  ulong uVar4;
  ulong uVar5;
  uv_timer_s *puVar6;
  
  if (((loop->stop_flag != 0) ||
      (((loop->active_handles == 0 && (loop->active_reqs == (void **)loop->active_reqs[0])) ||
       (loop->idle_handles != (void **)loop->idle_handles[0])))) ||
     (loop->closing_handles != (uv_handle_t *)0x0)) {
    return 0;
  }
  paVar3 = (anon_struct_32_4_548b78d9_for_tree_entry *)&loop->timer_handles;
  puVar1 = (uv_timer_s *)0x0;
  do {
    puVar6 = puVar1;
    puVar1 = paVar3->rbe_left;
    paVar3 = &puVar1->tree_entry;
  } while (puVar1 != (uv_timer_s *)0x0);
  if (puVar6 == (uv_timer_s *)0x0) {
    return -1;
  }
  uVar2 = puVar6->timeout;
  uVar5 = uVar2 - loop->time;
  uVar4 = 0;
  if ((loop->time <= uVar2 && uVar5 != 0) && (uVar4 = 0x7fffffff, uVar5 < 0x7fffffff)) {
    uVar4 = uVar5;
  }
  return (int)uVar4;
}

Assistant:

int uv_backend_timeout(const uv_loop_t* loop) {
  if (loop->stop_flag != 0)
    return 0;

  if (!uv__has_active_handles(loop) && !uv__has_active_reqs(loop))
    return 0;

  if (!QUEUE_EMPTY(&loop->idle_handles))
    return 0;

  if (loop->closing_handles)
    return 0;

  return uv__next_timeout(loop);
}